

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O1

LDSketch_t * LDSketch_init(int w,int h,int l,int lgn,longlong thresh_abs,uint tbl_id)

{
  LDSketch_t *pLVar1;
  dyn_tbl_t **ppdVar2;
  dyn_tbl_t *pdVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar7;
  undefined4 in_register_00000034;
  size_t __size;
  undefined4 in_register_0000003c;
  size_t __nmemb;
  long lVar8;
  int iVar9;
  uint uVar10;
  byte abStack_a8 [56];
  long *local_50 [2];
  long local_40 [2];
  
  iVar9 = (int)thresh_abs;
  __nmemb = CONCAT44(in_register_0000003c,w);
  __size = CONCAT44(in_register_00000034,h);
  if ((lgn < 0x70) && ((lgn & 7U) == 0)) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"LDSketch","");
    pLVar1 = (LDSketch_t *)safe_calloc(1,0x28,(char *)local_50[0]);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    uVar10 = h * w;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"tbl->tbl","");
    ppdVar2 = (dyn_tbl_t **)safe_calloc((long)(int)uVar10,8,(char *)local_50[0]);
    pLVar1->tbl = ppdVar2;
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (0 < (int)uVar10) {
      uVar7 = 0;
      do {
        pdVar3 = dyn_tbl_init(l,lgn,thresh_abs);
        ppdVar2[uVar7] = pdVar3;
        uVar7 = uVar7 + 1;
      } while (uVar10 != uVar7);
    }
    pLVar1->h = h;
    pLVar1->w = w;
    pLVar1->l = l;
    pLVar1->lgn = lgn;
    pLVar1->tbl_id = tbl_id;
    pLVar1->thresh_abs = (double)thresh_abs;
    return pLVar1;
  }
  LDSketch_init();
  abStack_a8[0x30] = 0xdd;
  abStack_a8[0x31] = 0x49;
  abStack_a8[0x32] = 0x10;
  abStack_a8[0x33] = 0;
  abStack_a8[0x34] = 0;
  abStack_a8[0x35] = 0;
  abStack_a8[0x36] = 0;
  abStack_a8[0x37] = 0;
  pLVar1 = (LDSketch_t *)calloc(__nmemb,__size);
  if (pLVar1 != (LDSketch_t *)0x0) {
    return pLVar1;
  }
  abStack_a8[0x30] = 0xec;
  abStack_a8[0x31] = 0x49;
  abStack_a8[0x32] = 0x10;
  abStack_a8[0x33] = 0;
  abStack_a8[0x34] = 0;
  abStack_a8[0x35] = 0;
  abStack_a8[0x36] = 0;
  abStack_a8[0x37] = 0;
  lVar8 = extraout_RDX;
  safe_calloc();
  abStack_a8[0x20] = 0;
  abStack_a8[0x21] = 0;
  abStack_a8[0x22] = 0;
  abStack_a8[0x23] = 0;
  abStack_a8[0x24] = 0;
  abStack_a8[0x25] = 0;
  abStack_a8[0x26] = 0;
  abStack_a8[0x27] = 0;
  abStack_a8[0x28] = 0;
  abStack_a8[0x29] = 0;
  abStack_a8[0x2a] = 0;
  abStack_a8[0x2b] = 0;
  abStack_a8[0x2c] = 0;
  abStack_a8[0x2d] = 0;
  abStack_a8[0x2e] = 0;
  abStack_a8[0x2f] = 0;
  abStack_a8[0x30] = 0;
  abStack_a8[0x31] = 0;
  abStack_a8[0] = 0;
  abStack_a8[1] = 0;
  abStack_a8[2] = 0;
  abStack_a8[3] = 0;
  abStack_a8[4] = 0;
  abStack_a8[5] = 0;
  abStack_a8[6] = 0;
  abStack_a8[7] = 0;
  abStack_a8[8] = 0;
  abStack_a8[9] = 0;
  abStack_a8[10] = 0;
  abStack_a8[0xb] = 0;
  abStack_a8[0xc] = 0;
  abStack_a8[0xd] = 0;
  abStack_a8[0xe] = 0;
  abStack_a8[0xf] = 0;
  abStack_a8[0x10] = 0;
  abStack_a8[0x11] = 0;
  abStack_a8[0x12] = 0;
  abStack_a8[0x13] = 0;
  abStack_a8[0x14] = 0;
  abStack_a8[0x15] = 0;
  abStack_a8[0x16] = 0;
  abStack_a8[0x17] = 0;
  abStack_a8[0x18] = 0;
  abStack_a8[0x19] = 0;
  abStack_a8[0x1a] = 0;
  abStack_a8[0x1b] = 0;
  abStack_a8[0x1c] = 0;
  abStack_a8[0x1d] = 0;
  abStack_a8[0x1e] = 0;
  abStack_a8[0x1f] = 0;
  uVar7 = extraout_RDX_00;
  while (iVar6 = (int)uVar7, iVar6 <= lgn) {
    iVar5 = iVar6 + 7;
    if (-1 < iVar6) {
      iVar5 = iVar6;
    }
    lVar4 = (long)(iVar5 >> 3);
    if (lgn - iVar6 < 7) {
      uVar10 = (uint)(byte)(7 - ((char)uVar7 - ((byte)iVar5 & 0xf8)));
      abStack_a8[lVar4] =
           abStack_a8[lVar4] |
           (byte)((*(byte *)(__size + lVar4) >> (uVar10 & 0x1f) & 1) << (uVar10 & 0x1f));
      iVar5 = 1;
    }
    else {
      abStack_a8[lVar4] = *(byte *)(__size + lVar4);
      iVar5 = 8;
    }
    uVar7 = (ulong)(uint)(iVar6 + iVar5);
  }
  iVar6 = *(int *)(lVar8 + 0x14);
  iVar5 = iVar6 + 7;
  if (-1 < iVar6) {
    iVar5 = iVar6;
  }
  iVar5 = iVar5 >> 3;
  *(int *)(abStack_a8 + iVar5) = *(int *)(lVar8 + 0x20) * *(int *)(lVar8 + 8) + iVar9;
  if (iVar5 == -4) {
    uVar10 = 0x510f68cf;
  }
  else {
    uVar10 = 0x172a550d;
    lVar4 = 0;
    do {
      uVar10 = (uint)abStack_a8[lVar4] + uVar10 * 0x172a554f;
      lVar4 = lVar4 + 1;
    } while (iVar5 + 4 != (int)lVar4);
    uVar10 = uVar10 ^ 0x46253dc2;
  }
  return (LDSketch_t *)((ulong)uVar10 % (ulong)*(uint *)(lVar8 + 0xc));
}

Assistant:

LDSketch_t* LDSketch_init(int w, int h, int l, int lgn, long long thresh_abs,
	unsigned int tbl_id) {
	LDSketch_t* LDSketch;

	// error checking
	if (lgn / 8 > 13 || lgn % 8 != 0) {  // maximum # of bits of a key = 104
		fprintf(stderr, "ERR: n too large or n not multiple of 8\n");
		exit(-1);
	}

	// safe calloc
	LDSketch = (LDSketch_t*)safe_calloc(1, sizeof(LDSketch_t),
		std::string("LDSketch").c_str());
	LDSketch->tbl = (dyn_tbl_t**)safe_calloc(h * w, sizeof(long long),
		std::string("tbl->tbl").c_str());
	for (int i = 0; i < h * w; ++i) {
		LDSketch->tbl[i] = dyn_tbl_init(l, lgn, thresh_abs);
	}

	// set parameters
	LDSketch->h = h;
	LDSketch->w = w;
	LDSketch->l = l;
	// LDSketch->size = h * w;
	LDSketch->lgn = lgn;
	LDSketch->tbl_id = tbl_id;
	LDSketch->thresh_abs = thresh_abs;
	// LDSketch->total = 0;

	// return
	return LDSketch;
}